

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveNocash(Parser *parser,int flags)

{
  bool bVar1;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[3]> _Var2;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[4]> _Var3;
  undefined4 in_register_00000034;
  unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> local_70;
  unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> local_68 [3];
  undefined4 local_4c;
  undefined1 local_48 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  stringValue;
  int flags_local;
  Parser *parser_local;
  
  getStringOrIdentifier_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48,(Parser *)CONCAT44(in_register_00000034,flags));
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
  if (bVar1) {
    _Var2 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_48,(char (*) [3])0x22a15f);
    if (_Var2) {
      Global.nocash = true;
      std::make_unique<DummyCommand>();
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<DummyCommand,std::default_delete<DummyCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 local_68);
      std::unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_>::~unique_ptr(local_68);
    }
    else {
      _Var3 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_48,(char (*) [4])"off");
      if (_Var3) {
        Global.nocash = false;
        std::make_unique<DummyCommand>();
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<DummyCommand,std::default_delete<DummyCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   &local_70);
        std::unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_>::~unique_ptr(&local_70);
      }
      else {
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<std::default_delete<CAssemblerCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (nullptr_t)0x0);
      }
    }
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  local_4c = 1;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_48);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveNocash(Parser& parser, int flags)
{
	auto stringValue = getStringOrIdentifier(parser);
	if (!stringValue)
		return nullptr;

	if (stringValue == "on")
	{	
		Global.nocash = true;
		return std::make_unique<DummyCommand>();
	} else if (stringValue == "off")
	{
		Global.nocash = false;
		return std::make_unique<DummyCommand>();
	}

	return nullptr;
}